

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O0

void * deAlignedRealloc(void *ptr,size_t numBytes,size_t alignBytes)

{
  size_t local_48;
  size_t copyBytes;
  void *newPtr;
  size_t oldSize;
  size_t alignBytes_local;
  size_t numBytes_local;
  void *ptr_local;
  
  if (ptr == (void *)0x0) {
    ptr_local = deAlignedMalloc(numBytes,alignBytes);
  }
  else if (numBytes == 0) {
    deAlignedFree(ptr);
    ptr_local = (void *)0x0;
  }
  else {
    local_48 = malloc_usable_size(ptr);
    if ((local_48 < numBytes) || (ptr_local = ptr, numBytes * 2 < local_48)) {
      ptr_local = deAlignedMalloc(numBytes,alignBytes);
      if (ptr_local == (void *)0x0) {
        ptr_local = (void *)0x0;
      }
      else {
        if (numBytes < local_48) {
          local_48 = numBytes;
        }
        deMemcpy(ptr_local,ptr,local_48);
        deAlignedFree(ptr);
      }
    }
  }
  return ptr_local;
}

Assistant:

void* deAlignedRealloc (void* ptr, size_t numBytes, size_t alignBytes)
{
#if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_WIN32)
	return _aligned_realloc(ptr, numBytes, alignBytes);

#elif (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC) || (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_POSIX)
	if (ptr)
	{
		if (numBytes > 0)
		{
#	if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC)
			const size_t				oldSize	= getAlignedAllocHeader(ptr)->numBytes;
#	else /* DE_ALIGNED_MALLOC_GENERIC */
			const size_t				oldSize	= malloc_usable_size(ptr);
#	endif

			DE_ASSERT(deIsAlignedPtr(ptr, alignBytes));

			if (oldSize < numBytes || oldSize > numBytes*2)
			{
				/* Create a new alloc if original is smaller, or more than twice the requested size */
				void* const	newPtr	= deAlignedMalloc(numBytes, alignBytes);

				if (newPtr)
				{
					const size_t	copyBytes	= numBytes < oldSize ? numBytes : oldSize;

					deMemcpy(newPtr, ptr, copyBytes);
					deAlignedFree(ptr);

					return newPtr;
				}
				else
					return DE_NULL;
			}
			else
				return ptr;
		}
		else
		{
			deAlignedFree(ptr);
			return DE_NULL;
		}
	}
	else
		return deAlignedMalloc(numBytes, alignBytes);

#else
#	error "Invalid DE_ALIGNED_MALLOC"
#endif
}